

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O1

void duckdb::udf_ternary_function<signed_char>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  long lVar1;
  long lVar2;
  reference pvVar3;
  ulong uVar4;
  
  duckdb::DataChunk::Flatten();
  duckdb::Vector::SetVectorType((VectorType)result);
  lVar1 = *(long *)(result + 0x20);
  pvVar3 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,2);
  lVar2 = *(long *)(pvVar3 + 0x20);
  pvVar3 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,2);
  FlatVector::VerifyFlatVector(pvVar3);
  FlatVector::VerifyFlatVector(result);
  *(undefined8 *)(result + 0x28) = *(undefined8 *)(pvVar3 + 0x28);
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30),
             (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(pvVar3 + 0x30));
  *(undefined8 *)(result + 0x40) = *(undefined8 *)(pvVar3 + 0x40);
  if (*(long *)(input + 0x18) != 0) {
    uVar4 = 0;
    do {
      if ((*(long *)(pvVar3 + 0x28) == 0) ||
         ((*(ulong *)(*(long *)(pvVar3 + 0x28) + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0)) {
        *(undefined1 *)(lVar1 + uVar4) = *(undefined1 *)(lVar2 + uVar4);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < *(ulong *)(input + 0x18));
  }
  return;
}

Assistant:

static void udf_ternary_function(DataChunk &input, ExpressionState &state, Vector &result) {
	input.Flatten();
	switch (GetTypeId<TYPE>()) {
	case PhysicalType::VARCHAR: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<string_t>(result);
		auto ldata = FlatVector::GetData<string_t>(input.data[2]);
		auto &validity = FlatVector::Validity(input.data[0]);

		FlatVector::SetValidity(result, FlatVector::Validity(input.data[2]));

		for (idx_t i = 0; i < input.size(); i++) {
			if (!validity.RowIsValid(i)) {
				continue;
			}
			auto input_length = ldata[i].GetSize();
			string_t target = StringVector::EmptyString(result, input_length);
			auto target_data = target.GetDataWriteable();
			memcpy(target_data, ldata[i].GetData(), input_length);
			target.Finalize();
			result_data[i] = target;
		}
		break;
	}
	default: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<TYPE>(result);
		auto ldata = FlatVector::GetData<TYPE>(input.data[2]);
		auto &mask = FlatVector::Validity(input.data[2]);
		FlatVector::SetValidity(result, mask);

		for (idx_t i = 0; i < input.size(); i++) {
			if (!mask.RowIsValid(i)) {
				continue;
			}
			result_data[i] = ldata[i];
		}
	}
	}
}